

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O2

xcb_generic_iterator_t
xcb_input_device_resolution_state_resolution_min_end(xcb_input_device_resolution_state_t *R)

{
  xcb_generic_iterator_t xVar1;
  
  xVar1._8_8_ = (ulong)(uint)((int)(R + (ulong)R->num_valuators + 1) - (int)R) << 0x20;
  xVar1.data = R + (ulong)R->num_valuators + 1;
  return xVar1;
}

Assistant:

xcb_generic_iterator_t
xcb_input_device_resolution_state_resolution_min_end (const xcb_input_device_resolution_state_t *R)
{
    xcb_generic_iterator_t i;
    xcb_generic_iterator_t prev = xcb_input_device_resolution_state_resolution_values_end(R);
    i.data = ((uint32_t *) ((char*) prev.data + XCB_TYPE_PAD(uint32_t, prev.index))) + (R->num_valuators);
    i.rem = 0;
    i.index = (char *) i.data - (char *) R;
    return i;
}